

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.hpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::BufferUniform::~BufferUniform(BufferUniform *this)

{
  BufferUniform *this_local;
  
  (this->super_UniformInfo)._vptr_UniformInfo = (_func_int **)&PTR__BufferUniform_016a9b20;
  de::SharedPtr<vk::Allocation>::~SharedPtr(&this->alloc);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr(&this->buffer);
  UniformInfo::~UniformInfo(&this->super_UniformInfo);
  return;
}

Assistant:

virtual						~BufferUniform	(void) {}